

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<std::pair<QString,_QString>_>::moveAppend
          (QGenericArrayOps<std::pair<QString,_QString>_> *this,pair<QString,_QString> *b,
          pair<QString,_QString> *e)

{
  qsizetype *pqVar1;
  pair<QString,_QString> *ppVar2;
  long lVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  
  if ((b != e) && (b < e)) {
    ppVar2 = (this->super_QArrayDataPointer<std::pair<QString,_QString>_>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<std::pair<QString,_QString>_>).size;
      pDVar4 = (b->first).d.d;
      (b->first).d.d = (Data *)0x0;
      ppVar2[lVar3].first.d.d = pDVar4;
      pcVar5 = (b->first).d.ptr;
      (b->first).d.ptr = (char16_t *)0x0;
      ppVar2[lVar3].first.d.ptr = pcVar5;
      qVar6 = (b->first).d.size;
      (b->first).d.size = 0;
      ppVar2[lVar3].first.d.size = qVar6;
      pDVar4 = (b->second).d.d;
      (b->second).d.d = (Data *)0x0;
      ppVar2[lVar3].second.d.d = pDVar4;
      pcVar5 = (b->second).d.ptr;
      (b->second).d.ptr = (char16_t *)0x0;
      ppVar2[lVar3].second.d.ptr = pcVar5;
      qVar6 = (b->second).d.size;
      (b->second).d.size = 0;
      ppVar2[lVar3].second.d.size = qVar6;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<std::pair<QString,_QString>_>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }